

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall
Memory::Recycler::VerifyPageHeapFillAfterAlloc
          (Recycler *this,char *memBlock,size_t size,ObjectInfoBits attributes)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  LargeHeapBlock *this_00;
  IdleDecommitPageAllocator *this_01;
  LargeHeapBlock *largeHeapBlock;
  HeapBlock *heapBlock;
  ObjectInfoBits attributes_local;
  size_t size_local;
  char *memBlock_local;
  Recycler *this_local;
  
  if (memBlock == (char *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1e54,"(memBlock != nullptr)","memBlock != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IsPageHeapEnabled(this);
  if (bVar2) {
    this_00 = (LargeHeapBlock *)FindHeapBlock(this,memBlock);
    if (this_00 == (LargeHeapBlock *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x1e58,"(heapBlock)","heapBlock");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    bVar2 = HeapBlock::IsLargeHeapBlock((HeapBlock *)this_00);
    if ((bVar2) && (bVar2 = LargeHeapBlock::InPageHeapMode(this_00), bVar2)) {
      this_01 = HeapBlock::GetPageAllocator((HeapBlock *)this_00,this_00->heapInfo);
      bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::IsPageReuseDisabled(&this_01->super_PageAllocator);
      if (!bVar2) {
        LargeHeapBlock::VerifyPageHeapPattern(this_00);
      }
    }
  }
  return;
}

Assistant:

void Recycler::VerifyPageHeapFillAfterAlloc(char* memBlock, size_t size, ObjectInfoBits attributes)
{
    Assert(memBlock != nullptr);
    if (IsPageHeapEnabled())
    {
        HeapBlock* heapBlock = this->FindHeapBlock(memBlock);
        Assert(heapBlock);
        if (heapBlock->IsLargeHeapBlock())
        {
            LargeHeapBlock* largeHeapBlock = (LargeHeapBlock*)heapBlock;
            if (largeHeapBlock->InPageHeapMode()
#ifdef RECYCLER_NO_PAGE_REUSE
                && !largeHeapBlock->GetPageAllocator(largeHeapBlock->heapInfo)->IsPageReuseDisabled()
#endif
                )
            {
                largeHeapBlock->VerifyPageHeapPattern();
            }
        }
    }
}